

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O1

ssize_t __thiscall
merlin::graphical_model::write(graphical_model *this,int __fd,void *__buf,size_t __n)

{
  char cVar1;
  ostream *poVar2;
  pointer pdVar3;
  long *plVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  ostream *poVar6;
  pointer pfVar7;
  ulong uVar8;
  long lVar9;
  
  poVar6 = (ostream *)CONCAT44(in_register_00000034,__fd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"MARKOV",6);
  cVar1 = (char)__fd;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pdVar3 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    uVar8 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>(pdVar3[uVar8]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      uVar8 = uVar8 + 1;
      pdVar3 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->m_dims).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar3 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pfVar7 = (this->m_factors).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_factors).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar7) {
    uVar8 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      if (pfVar7[uVar8].v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          pfVar7[uVar8].v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar9 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          lVar9 = lVar9 + 1;
        } while (lVar9 != (long)pfVar7[uVar8].v_.m_v.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)pfVar7[uVar8].v_.m_v.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      uVar8 = uVar8 + 1;
      pfVar7 = (this->m_factors).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)(((long)(this->m_factors).
                                    super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar7 >> 5)
                            * -0x5555555555555555));
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar1);
  std::ostream::put(cVar1);
  uVar8 = std::ostream::flush();
  pfVar7 = (this->m_factors).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_factors).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar7) {
    uVar5 = 0;
    do {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (pfVar7[uVar5].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pfVar7[uVar5].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar8 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          lVar9 = *(long *)poVar6;
          *(uint *)(poVar6 + *(long *)(lVar9 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(lVar9 + -0x18) + 0x18) | 4;
          *(undefined8 *)(poVar6 + *(long *)(lVar9 + -0x18) + 8) = 8;
          std::ostream::_M_insert<double>
                    (pfVar7[uVar5].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8]);
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)((long)pfVar7[uVar5].t_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)pfVar7[uVar5].t_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 3));
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar1);
      std::ostream::put(cVar1);
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
      pfVar7 = (this->m_factors).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->m_factors).
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar7 >> 5) * -0x5555555555555555;
    } while (uVar5 < uVar8);
  }
  return uVar8;
}

Assistant:

void write(std::ostream& os) {

		// Write the header
		os << "MARKOV" << std::endl;
		os << nvar() << std::endl;
		for (size_t i = 0; i < m_dims.size(); ++i) {
			os << m_dims[i] << " ";
		}
		os << std::endl;

		// Write the factor scopes
		os << num_factors() << std::endl;
		for (size_t i = 0; i < m_factors.size(); ++i) {
			const factor& f = m_factors[i];
			os << f.nvar();
			variable_set::const_iterator si = f.vars().begin();
			for (; si != f.vars().end(); ++si) {
				os << " " << (*si).label();
			}
			os << std::endl;
		}

		// Write the factor tables
		os << std::endl;
		for (size_t i = 0; i < m_factors.size(); ++i) {
			const factor& f = m_factors[i];
			os << f.numel() << std::endl;
			for (size_t j = 0; j < f.numel(); ++j) {
				os << " " << std::setiosflags(std::ios::fixed)
					<< std::setprecision(8) << f[j];
			}
			os << std::endl << std::endl;
		}
	}